

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

wostream * mjs::operator<<(wostream *os,token *t)

{
  token_type tVar1;
  wostream *pwVar2;
  wstring *pwVar3;
  wstring_view *s;
  wstring wStack_48;
  size_type local_28;
  pointer local_20;
  
  pwVar2 = std::operator<<(os,"token{");
  operator<<(pwVar2,t->type_);
  tVar1 = t->type_;
  if ((tVar1 == identifier) || (tVar1 == string_literal)) {
    pwVar2 = std::operator<<(os,", \"");
    pwVar3 = token::text_abi_cxx11_(t);
    local_20 = (pwVar3->_M_dataplus)._M_p;
    local_28 = pwVar3->_M_string_length;
    cpp_quote_abi_cxx11_(&wStack_48,(mjs *)&local_28,s);
    pwVar2 = std::operator<<(pwVar2,(wstring *)&wStack_48);
    std::operator<<(pwVar2,"\"");
    std::__cxx11::wstring::~wstring((wstring *)&wStack_48);
  }
  else if (tVar1 == numeric_literal) {
    std::operator<<(os,", ");
    std::wostream::_M_insert<double>((t->field_1).dvalue_);
  }
  pwVar2 = std::operator<<(os,"}");
  return pwVar2;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const token& t) {
    os << "token{" << t.type();
    if (t.type() == token_type::numeric_literal) {
        os << ", " << t.dvalue_;
    } else if (t.has_text()) {
        os << ", \"" << cpp_quote(t.text()) << "\"";
    }
    return os << "}";
}